

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor_rational.hpp
# Opt level: O1

void __thiscall
soplex::SLUFactorRational::solveLeft
          (SLUFactorRational *this,SSVectorRational *x,VectorRational *y,VectorRational *z,
          SVectorRational *rhs1,SSVectorRational *rhs2,SSVectorRational *rhs3)

{
  int rn2;
  rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>>
  *prVar1;
  int *idx;
  Rational *vec;
  Rational *vec2;
  Rational *rhs2_00;
  int *ridx2;
  Rational *vec3;
  int iVar2;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *v;
  rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>>
  *prVar3;
  longlong local_60;
  vector<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
  *__range2;
  SVectorRational *local_50;
  VectorRational *local_48;
  pointer local_40;
  int *local_38;
  
  __range2 = &z->val;
  local_50 = rhs1;
  (*this->solveTime->_vptr_Timer[3])();
  (this->ssvec).setupStatus = false;
  local_38 = (this->ssvec).super_IdxSet.idx;
  local_40 = (this->ssvec).
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
             .val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::clear(x);
  prVar3 = (rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>>
            *)(y->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  prVar1 = (rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>>
            *)(y->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_48 = y;
  if (prVar3 != prVar1) {
    do {
      local_60 = 0;
      boost::
      rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>>
      ::operator=(prVar3,&local_60);
      prVar3 = prVar3 + 0x40;
    } while (prVar3 != prVar1);
  }
  prVar3 = (rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>>
            *)(__range2->
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
  prVar1 = (rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>>
            *)(__range2->
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  if (prVar3 != prVar1) {
    do {
      local_60 = 0;
      boost::
      rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>>
      ::operator=(prVar3,&local_60);
      prVar3 = prVar3 + 0x40;
    } while (prVar3 != prVar1);
  }
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>>
  ::
  assign<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>>
            ((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>>
              *)&this->ssvec,local_50);
  iVar2 = (this->ssvec).super_IdxSet.num;
  x->setupStatus = false;
  idx = (x->super_IdxSet).idx;
  vec = (x->
        super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        ).val.
        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  vec2 = (local_48->val).
         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  rhs2->setupStatus = false;
  rhs2_00 = (rhs2->
            super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
            ).val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ridx2 = (rhs2->super_IdxSet).idx;
  rn2 = (rhs2->super_IdxSet).num;
  vec3 = (__range2->
         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
  rhs3->setupStatus = false;
  iVar2 = CLUFactorRational::vSolveLeft3
                    (&this->super_CLUFactorRational,vec,idx,local_40,local_38,iVar2,vec2,rhs2_00,
                     ridx2,rn2,vec3,
                     (rhs3->
                     super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                     ).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,(rhs3->super_IdxSet).idx,
                     (rhs3->super_IdxSet).num);
  (x->super_IdxSet).num = iVar2;
  x->setupStatus = 0 < iVar2;
  (this->ssvec).super_IdxSet.num = 0;
  (this->ssvec).setupStatus = true;
  this->solveCount = this->solveCount + 1;
  (*this->solveTime->_vptr_Timer[4])();
  return;
}

Assistant:

inline void SLUFactorRational::solveLeft(
   SSVectorRational&      x,
   VectorRational&        y,
   VectorRational&        z,
   const SVectorRational& rhs1,
   SSVectorRational&      rhs2,
   SSVectorRational&      rhs3)
{

   solveTime->start();

   int   n;
   Rational* svec = ssvec.altValues();
   int*  sidx = ssvec.altIndexMem();

   x.clear();
   y.clear();
   z.clear();
   ssvec.assign(rhs1);
   n = ssvec.size(); // see altValues();
   n = vSolveLeft3(x.altValues(), x.altIndexMem(), svec, sidx, n,
                   y.get_ptr(), rhs2.altValues(), rhs2.altIndexMem(), rhs2.size(),
                   z.get_ptr(), rhs3.altValues(), rhs3.altIndexMem(), rhs3.size());

   x.setSize(n);

   if(n > 0)
      x.forceSetup();
   else
      x.unSetup();

   ssvec.setSize(0);
   ssvec.forceSetup();

   solveCount++;
   solveTime->stop();
}